

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

int sf_sizeofheaders(GlobalVars *gv,lword addr,lword *res)

{
  MemoryDescr *vmreg;
  Phdr *pPVar1;
  unsigned_long uVar2;
  
  vmreg = defmem;
  pPVar1 = find_phdr(gv," headers",defmem,defmem);
  if (pPVar1 == (Phdr *)0x0) {
    add_phdr(gv," headers",6,0x400,-1,vmreg,vmreg);
  }
  uVar2 = (*fff[gv->dest_format]->headersize)(gv);
  *res = uVar2;
  return 1;
}

Assistant:

static int sf_sizeofheaders(struct GlobalVars *gv,lword addr,lword *res)
{
  /* SIZEOF_HEADERS means that we want to include File- and PHDR in
     the first ELF segment */
  if (!find_phdr(gv,defhdr,defmem,defmem))
    add_phdr(gv,defhdr,PT_PHDR,PHDR_PHDRS,ADDR_NONE,defmem,defmem);

  *res = fff[gv->dest_format]->headersize(gv);
  return 1;
}